

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

iterator * __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::insert_at<int>(iterator *__return_storage_ptr__,
                dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                *this,size_type pos,int *args)

{
  pointer pAVar1;
  size_type sVar2;
  pointer pAVar3;
  length_error *this_00;
  
  sVar2 = this->num_deleted;
  if (this->num_elements - sVar2 < 0x3fffffffffffffff) {
    if ((sVar2 == 0) || ((this->key_info).delkey._i != this->table[pos]._i)) {
      this->num_elements = this->num_elements + 1;
    }
    else {
      this->num_deleted = sVar2 - 1;
    }
    pAVar3 = this->table;
    pAVar1 = pAVar3 + pos;
    pAVar1->_i = *args;
    sVar2 = this->num_buckets;
    __return_storage_ptr__->ht = this;
    __return_storage_ptr__->pos = pAVar1;
    __return_storage_ptr__->end = pAVar3 + sVar2;
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }